

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-time.c
# Opt level: O1

int coda_time_string_to_parts
              (char *format,char *str,int *year,int *month,int *day,int *hour,int *minute,
              int *second,int *musec)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  undefined8 uVar4;
  char *pcVar5;
  ulong uVar6;
  long lVar7;
  
  if (format == (char *)0x0) {
    pcVar5 = "format argument is NULL (%s:%u)";
    uVar4 = 0x5bc;
  }
  else if (str == (char *)0x0) {
    pcVar5 = "str argument is NULL (%s:%u)";
    uVar4 = 0x5c1;
  }
  else {
    if ((musec != (int *)0x0 && second != (int *)0x0) &&
        (minute != (int *)0x0 &&
        ((hour != (int *)0x0 && day != (int *)0x0) && (month != (int *)0x0 && year != (int *)0x0))))
    {
      cVar2 = *format;
      if (cVar2 != '\0') {
        uVar6 = 0;
        bVar1 = false;
        do {
          if (cVar2 == '|' && !bVar1) {
            iVar3 = string_to_parts(format,str,year,month,day,hour,minute,second,musec);
            do {
              if (iVar3 == 0) {
                return 0;
              }
              lVar7 = (long)(int)uVar6;
              if (format[lVar7] == '\0') {
                coda_set_error(-0x68,"date/time argument (%s) did not match any of the formats (%s)"
                               ,str,format);
                return -1;
              }
              cVar2 = format[lVar7 + 1];
              uVar6 = lVar7 + 1;
              iVar3 = (int)uVar6;
              if (cVar2 != '\0') {
                pcVar5 = format + (long)iVar3 + 1;
                do {
                  if ((!bVar1) && (cVar2 == '|')) break;
                  if (cVar2 == '\'') {
                    bVar1 = !bVar1;
                  }
                  uVar6 = (ulong)((int)uVar6 + 1);
                  cVar2 = *pcVar5;
                  pcVar5 = pcVar5 + 1;
                } while (cVar2 != '\0');
              }
              iVar3 = string_to_parts(format + iVar3,str,year,month,day,hour,minute,second,musec);
            } while( true );
          }
          if (cVar2 == '\'') {
            bVar1 = !bVar1;
          }
          cVar2 = format[uVar6 + 1];
          uVar6 = uVar6 + 1;
        } while (cVar2 != '\0');
      }
      iVar3 = string_to_parts(format,str,year,month,day,hour,minute,second,musec);
      return iVar3;
    }
    pcVar5 = "date/time argument(s) are NULL (%s:%u)";
    uVar4 = 0x5c7;
  }
  coda_set_error(-100,pcVar5,
                 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-time.c"
                 ,uVar4);
  return -1;
}

Assistant:

LIBCODA_API int coda_time_string_to_parts(const char *format, const char *str, int *year, int *month, int *day,
                                          int *hour, int *minute, int *second, int *musec)
{
    int literal = 0;
    int n = 0;

    if (format == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "format argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (str == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "str argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (year == NULL || month == NULL || day == NULL || hour == NULL || minute == NULL || second == NULL ||
        musec == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "date/time argument(s) are NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }

    while (format[n] != '\0' && (literal || format[n] != '|'))
    {
        if (format[n] == '\'')
        {
            literal = !literal;
        }
        n++;
    }
    if (format[n] == '|')
    {
        int offset = 0;

        /* try multiple formats */
        while (1)
        {
            if (string_to_parts(&format[offset], str, year, month, day, hour, minute, second, musec) == 0)
            {
                /* found a format that works */
                return 0;
            }
            if (format[n] == '\0')
            {
                /* the string matched none of the formats */
                coda_set_error(CODA_ERROR_INVALID_DATETIME,
                               "date/time argument (%s) did not match any of the formats (%s)", str, format);
                return -1;
            }
            n++;
            offset = n;
            while (format[n] != '\0' && (literal || format[n] != '|'))
            {
                if (format[n] == '\'')
                {
                    literal = !literal;
                }
                n++;
            }
        }
    }

    return string_to_parts(format, str, year, month, day, hour, minute, second, musec);
}